

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O2

bool __thiscall depspawn::internal::arg_info::is_contained_array(arg_info *this,arg_info *other)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = (uint)this->rank;
  uVar2 = 0;
  if ('\0' < this->rank) {
    uVar2 = (ulong)uVar1;
  }
  do {
    for (uVar3 = 0;
        ((uVar4 = uVar2, uVar2 != uVar3 &&
         (uVar4 = uVar3, other->array_range[uVar3].first <= this->array_range[uVar3].first)) &&
        (this->array_range[uVar3].second <= other->array_range[uVar3].second)); uVar3 = uVar3 + 1) {
    }
  } while ((((uint)uVar4 != uVar1) && (other = other->next, other != (arg_info *)0x0)) &&
          (this->addr == other->addr));
  return (uint)uVar4 == uVar1;
}

Assistant:

bool arg_info::is_contained_array(const arg_info *other) const
    { int i;
      
      const int lim = rank;
      
      do {

          assert(lim == other->rank);
          
          for(i = 0; i < lim; i++) {
            if(!contains_intervals(std::get<0>(other->array_range[i]), std::get<1>(other->array_range[i]),
                                   std::get<0>(array_range[i]), std::get<1>(array_range[i])))
              break;
          }
          
          if(i == lim) {
            //if(depspawn::debug) std::cout << "DEP FOUND\n";
            return true;
          }

 
        other = other->next;

      } while(other && (addr == other->addr));
      
      return false;
    }